

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglconvenience.cpp
# Opt level: O3

bool q_hasEglExtension(EGLDisplay display,char *extensionName)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  char *pcVar4;
  long lVar5;
  long in_FS_OFFSET;
  QByteArray local_60;
  QArrayDataPointer<QByteArray> local_48;
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d._0_4_ = 0xaaaaaaaa;
  local_48.d._4_4_ = 0xaaaaaaaa;
  local_48.ptr._0_4_ = 0xaaaaaaaa;
  local_48.ptr._4_4_ = 0xaaaaaaaa;
  local_30 = extensionName;
  pcVar4 = (char *)eglQueryString(display,0x3055);
  QByteArray::QByteArray(&local_60,pcVar4,-1);
  QByteArray::split((char)&local_48);
  if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,1,0x10);
    }
  }
  if ((undefined1 *)local_48.size == (undefined1 *)0x0) {
LAB_0057e4dd:
    bVar3 = false;
  }
  else {
    lVar2 = CONCAT44(local_48.ptr._4_4_,local_48.ptr._0_4_);
    lVar1 = local_48.size * 0x18;
    lVar5 = 0;
    do {
      if (lVar1 == lVar5) goto LAB_0057e4dd;
      bVar3 = operator==((QByteArray *)(lVar2 + lVar5),&local_30);
      lVar5 = lVar5 + 0x18;
    } while (!bVar3);
    bVar3 = CONCAT44(local_48.ptr._4_4_,local_48.ptr._0_4_) - lVar2 != lVar5;
  }
  QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool q_hasEglExtension(EGLDisplay display, const char* extensionName)
{
    QList<QByteArray> extensions =
        QByteArray(reinterpret_cast<const char *>
            (eglQueryString(display, EGL_EXTENSIONS))).split(' ');
    return extensions.contains(extensionName);
}